

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall
helics::TimeDependencies::checkIfReadyForExecEntry
          (TimeDependencies *this,bool iterating,bool waiting)

{
  const_iterator cVar1;
  const_iterator cVar2;
  byte in_DL;
  byte in_SIL;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffff98
  ;
  _func_bool_DependencyInfo_ptr *in_stack_ffffffffffffffb0;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffffc0;
  undefined1 local_1;
  
  if ((in_SIL & 1) == 0) {
    if ((in_DL & 1) == 0) {
      cVar1 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                        (in_stack_ffffffffffffff98);
      cVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                        (in_stack_ffffffffffffff98);
      local_1 = std::
                none_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::TimeDependencies::checkIfReadyForExecEntry(bool,bool)const::__1>
                          (cVar1._M_current,cVar2._M_current);
    }
    else {
      local_1 = checkIfAllDependenciesArePastExec
                          ((TimeDependencies *)in_stack_ffffffffffffffc0._M_current,
                           SUB81((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38,0));
    }
  }
  else if ((in_DL & 1) == 0) {
    cVar1 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                      (in_stack_ffffffffffffff98);
    cVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                      (in_stack_ffffffffffffff98);
    local_1 = std::
              none_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::TimeDependencies::checkIfReadyForExecEntry(bool,bool)const::__0>
                        (cVar1._M_current,cVar2._M_current);
  }
  else {
    std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
              (in_stack_ffffffffffffff98);
    std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
              (in_stack_ffffffffffffff98);
    local_1 = std::
              all_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,bool(*)(helics::DependencyInfo_const&)>
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
  }
  return local_1;
}

Assistant:

bool TimeDependencies::checkIfReadyForExecEntry(bool iterating, bool waiting) const
{
    if (iterating) {
        if (waiting) {
            return std::all_of(dependencies.begin(),
                               dependencies.end(),
                               iteratingWaitingDependencyCheck);
        }
        return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
            return (dep.dependency && dep.mTimeState == TimeState::initialized);
        });
    }
    if (waiting) {
        return checkIfAllDependenciesArePastExec(false);
    }
    return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
        return (dep.dependency &&
                (!(dep.mTimeState >= TimeState::exec_requested ||
                   (dep.connection == ConnectionType::SELF &&
                    dep.mTimeState >= TimeState::initialized))));
    });
}